

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

int sink_checkphi(jit_State *J,IRIns *ira,IRRef ref)

{
  int iVar1;
  IRIns *pIVar2;
  byte local_31;
  IRIns *ir;
  IRRef ref_local;
  IRIns *ira_local;
  jit_State *J_local;
  
  if (ref < 0x8001) {
    J_local._4_4_ = 1;
  }
  else {
    pIVar2 = (J->cur).ir + ref;
    if ((((pIVar2->field_1).t.irt & 0x40) == 0) &&
       ((((pIVar2->field_1).o != '[' || ((pIVar2->field_0).op2 != 0x1d3)) ||
        ((*(byte *)((long)(J->cur).ir + (ulong)(pIVar2->field_0).op1 * 8 + 4) & 0x40) == 0)))) {
      local_31 = 0;
      if (ref < J->loopref) {
        iVar1 = sink_phidep(J,ref);
        local_31 = iVar1 != 0 ^ 0xff;
      }
      J_local._4_4_ = (uint)(local_31 & 1);
    }
    else {
      (ira->field_0).prev = (ira->field_0).prev + 1;
      J_local._4_4_ = 1;
    }
  }
  return J_local._4_4_;
}

Assistant:

static int sink_checkphi(jit_State *J, IRIns *ira, IRRef ref)
{
  if (ref >= REF_FIRST) {
    IRIns *ir = IR(ref);
    if (irt_isphi(ir->t) || (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT &&
			     irt_isphi(IR(ir->op1)->t))) {
      ira->prev++;
      return 1;  /* Sinkable PHI. */
    }
    /* Otherwise the value must be loop-invariant. */
    return ref < J->loopref && !sink_phidep(J, ref);
  }
  return 1;  /* Constant (non-PHI). */
}